

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.c
# Opt level: O1

GLADapiproc glad_gl_get_proc(char *name,void *vuserptr)

{
  long lVar1;
  GLADapiproc p_Var2;
  
  lVar1 = *vuserptr;
  if (*(code **)((long)vuserptr + 8) == (code *)0x0) {
    p_Var2 = (GLADapiproc)0x0;
  }
  else {
    p_Var2 = (GLADapiproc)(**(code **)((long)vuserptr + 8))(name);
  }
  if (p_Var2 == (GLADapiproc)0x0) {
    if (lVar1 != 0) {
      p_Var2 = (GLADapiproc)dlsym(lVar1,name);
      return p_Var2;
    }
    p_Var2 = (GLADapiproc)0x0;
  }
  return p_Var2;
}

Assistant:

static GLADapiproc glad_gl_get_proc(const char *name, void *vuserptr) {
    struct _glad_gl_userptr userptr = *(struct _glad_gl_userptr*) vuserptr;
    GLADapiproc result = NULL;

#ifndef __APPLE__
    if(userptr.gl_get_proc_address_ptr != NULL) {
        result = GLAD_GNUC_EXTENSION (GLADapiproc) userptr.gl_get_proc_address_ptr(name);
    }
#endif
    if(result == NULL) {
        result = glad_dlsym_handle(userptr.gl_handle, name);
    }

    return result;
}